

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lp_test.cc
# Opt level: O2

void __thiscall fizplex::LPTest_AddRowFromRow_Test::TestBody(LPTest_AddRowFromRow_Test *this)

{
  Row row;
  size_t sVar1;
  Row *pRVar2;
  char *in_R9;
  AssertHelper local_f0;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e8;
  string local_e0;
  AssertionResult gtest_ar_;
  Row r;
  LP lp;
  
  LP::LP(&lp);
  LP::Row::Row(&r,LE,-1.33333,302.0);
  row.lower = r.lower;
  row.type = r.type;
  row._4_4_ = r._4_4_;
  row.upper = r.upper;
  LP::add_row(&lp,row);
  sVar1 = LP::row_count(&lp);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  gtest_ar_.success_ = sVar1 == 1;
  if (!gtest_ar_.success_) {
    testing::Message::Message((Message *)&local_e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_e0,(internal *)&gtest_ar_,(AssertionResult *)"lp.row_count() == 1","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/lp_test.cc"
               ,0x51,local_e0._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_f0,(Message *)&local_e8);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    std::__cxx11::string::~string((string *)&local_e0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_e8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  pRVar2 = LP::row_header(&lp,0);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  gtest_ar_.success_ = pRVar2->type == LE;
  if (!gtest_ar_.success_) {
    testing::Message::Message((Message *)&local_e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_e0,(internal *)&gtest_ar_,
               (AssertionResult *)"lp.row_header(0u).type == RowType::LE","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/lp_test.cc"
               ,0x52,local_e0._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_f0,(Message *)&local_e8);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    std::__cxx11::string::~string((string *)&local_e0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_e8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  LP::~LP(&lp);
  return;
}

Assistant:

TEST(LPTest, AddRowFromRow) {
  LP lp;
  LP::Row r(RowType::LE, -1.33333, 302);
  lp.add_row(r);
  EXPECT_TRUE(lp.row_count() == 1);
  EXPECT_TRUE(lp.row_header(0u).type == RowType::LE);
}